

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cc
# Opt level: O2

VectorXd __thiscall Util::StdVec2Eigen(Util *this,vector<double,_std::allocator<double>_> *vec1)

{
  long lVar1;
  int ii;
  long lVar2;
  VectorXd VVar3;
  int n;
  int local_1c;
  
  local_1c = (int)((ulong)((long)(vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                                 .super__Vector_impl_data._M_finish -
                          (long)(vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                super__Vector_impl_data._M_start) >> 3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>
            ((Matrix<double,__1,_1,_0,__1,_1> *)this,&local_1c);
  lVar1 = *(long *)this;
  for (lVar2 = 0; lVar2 < local_1c; lVar2 = lVar2 + 1) {
    *(double *)(lVar1 + lVar2 * 8) =
         (vec1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
         ._M_start[lVar2];
  }
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = lVar2;
  VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)this;
  return (VectorXd)VVar3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage;
}

Assistant:

Eigen::VectorXd StdVec2Eigen(std::vector<double> vec1){

		//locals
		int n = vec1.size();
		Eigen::VectorXd vec2(n);

		//loop
		for (int ii = 0; ii < n; ++ii){
			vec2[ii] = vec1[ii];
		}

		//output
		return vec2;

	}